

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O0

bool __thiscall aeron::Subscription::isConnected(Subscription *this)

{
  ulong uVar1;
  Image *pIVar2;
  bool bVar3;
  ImageList *pIVar4;
  ulong local_38;
  size_t i;
  Image *images;
  size_t length;
  ImageList *imageList;
  Subscription *this_local;
  
  pIVar4 = std::atomic_load_explicit<aeron::ImageList*>(&this->m_imageList,memory_order_acquire);
  uVar1 = pIVar4->m_length;
  pIVar2 = pIVar4->m_images;
  local_38 = 0;
  while ((local_38 < uVar1 && (bVar3 = Image::isClosed(pIVar2 + local_38), bVar3))) {
    local_38 = local_38 + 1;
  }
  return true;
}

Assistant:

inline bool isConnected() const
    {
        const struct ImageList *imageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        const std::size_t length = imageList->m_length;
        Image *images = imageList->m_images;

        for (std::size_t i = 0; i < length; i++)
        {
            if (!images[i].isClosed())
            {
                return true;
            }
        }

        return true;
    }